

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall CPU::MOS6502::State::ExecutionState::ExecutionState(ExecutionState *this)

{
  bool bVar1;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  ExecutionState *local_10;
  ExecutionState *this_local;
  
  local_10 = this;
  Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::StructImpl
            (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>);
  (this->super_StructImpl<CPU::MOS6502::State::ExecutionState>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00ca94c8;
  bVar1 = Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::needs_declare
                    (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>);
  if (bVar1) {
    Reflection::Enum::declare<CPU::MOS6502::State::ExecutionState::Phase>
              ("Phase","Instruction, Stopped, Waiting, Jammed, Ready");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"phase",&local_41);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::
    declare<CPU::MOS6502::State::ExecutionState::Phase>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->phase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"micro_program",&local_69);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<int>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->micro_program,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"micro_program_offset",&local_91);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<int>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,
               &this->micro_program_offset,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"operation",&local_b9);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->operation,
               &local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"operand",&local_e1);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->operand,&local_e0
              );
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"address",&local_109);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->address,
               &local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"next_address",&local_131);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->next_address,
               &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  return;
}

Assistant:

State::ExecutionState::ExecutionState() {
	if(needs_declare()) {
		AnnounceEnum(Phase);
		DeclareField(phase);
		DeclareField(micro_program);
		DeclareField(micro_program_offset);
		DeclareField(operation);
		DeclareField(operand);
		DeclareField(address);
		DeclareField(next_address);
	}
}